

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O2

void gray_render_conic(PWorker worker,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  PVG_FT_Vector *pPVar9;
  PVG_FT_Vector bez_stack [33];
  
  pPVar9 = bez_stack;
  bez_stack[0].x = to->x * 4;
  bez_stack[0].y = to->y * 4;
  bez_stack[1].x = control->x << 2;
  bez_stack[1].y = control->y << 2;
  bez_stack[2].x = worker->x;
  bez_stack[2].y = worker->y;
  lVar6 = to->y >> 6;
  lVar1 = worker->max_ey;
  lVar4 = control->y >> 6;
  if (((lVar6 < lVar1) || (bez_stack[2].y >> 8 < lVar1 || lVar4 < lVar1)) &&
     (lVar1 = worker->min_ey, lVar1 <= bez_stack[2].y >> 8 || (lVar1 <= lVar4 || lVar1 <= lVar6))) {
    uVar7 = bez_stack[0].x + control->x * -8 + worker->x;
    uVar2 = -uVar7;
    if (0 < (long)uVar7) {
      uVar2 = uVar7;
    }
    uVar5 = bez_stack[0].y + control->y * -8 + bez_stack[2].y;
    uVar7 = -uVar5;
    if (0 < (long)uVar5) {
      uVar7 = uVar5;
    }
    if (uVar7 < uVar2) {
      uVar7 = uVar2;
    }
    uVar3 = 1;
    for (; 0x40 < uVar7; uVar7 = uVar7 >> 2) {
      uVar3 = uVar3 * 2;
    }
    do {
      pPVar9 = (PVG_FT_Vector *)((long)pPVar9 + -0x20);
      for (uVar8 = 1; (uVar8 & uVar3) == 0; uVar8 = uVar8 * 2) {
        *(long *)((long)pPVar9 + 0x60) = *(long *)((long)pPVar9 + 0x40);
        lVar1 = (*(long *)((long)pPVar9 + 0x40) + *(long *)((long)pPVar9 + 0x30)) / 2;
        *(long *)((long)pPVar9 + 0x50) = lVar1;
        lVar4 = (*(long *)((long)pPVar9 + 0x30) + *(long *)((long)pPVar9 + 0x20)) / 2;
        *(long *)((long)pPVar9 + 0x30) = lVar4;
        *(long *)((long)pPVar9 + 0x40) = (lVar4 + lVar1) / 2;
        *(long *)((long)pPVar9 + 0x68) = *(long *)((long)pPVar9 + 0x48);
        lVar1 = (*(long *)((long)pPVar9 + 0x48) + *(long *)((long)pPVar9 + 0x38)) / 2;
        *(long *)((long)pPVar9 + 0x58) = lVar1;
        lVar4 = (*(long *)((long)pPVar9 + 0x38) + *(long *)((long)pPVar9 + 0x28)) / 2;
        *(long *)((long)pPVar9 + 0x38) = lVar4;
        *(long *)((long)pPVar9 + 0x48) = (lVar4 + lVar1) / 2;
        pPVar9 = (PVG_FT_Vector *)((long)pPVar9 + 0x20);
      }
      gray_render_line(worker,*(TPos *)((long)pPVar9 + 0x20),*(TPos *)((long)pPVar9 + 0x28));
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  else {
    worker->x = bez_stack[0].x;
    worker->y = bez_stack[0].y;
  }
  return;
}

Assistant:

static void
  gray_render_conic( RAS_ARG_ const PVG_FT_Vector*  control,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 2 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    TPos        dx, dy;
    int         draw, split;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control->x );
    arc[1].y = UPSCALE( control->y );
    arc[2].x = ras.x;
    arc[2].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    dx = PVG_FT_ABS( arc[2].x + arc[0].x - 2 * arc[1].x );
    dy = PVG_FT_ABS( arc[2].y + arc[0].y - 2 * arc[1].y );
    if ( dx < dy )
      dx = dy;

    /* We can calculate the number of necessary bisections because  */
    /* each bisection predictably reduces deviation exactly 4-fold. */
    /* Even 32-bit deviation would vanish after 16 bisections.      */
    draw = 1;
    while ( dx > ONE_PIXEL / 4 )
    {
      dx >>= 2;
      draw <<= 1;
    }

    /* We use decrement counter to count the total number of segments */
    /* to draw starting from 2^level. Before each draw we split as    */
    /* many times as there are trailing zeros in the counter.         */
    do
    {
      split = 1;
      while ( ( draw & split ) == 0 )
      {
        gray_split_conic( arc );
        arc += 2;
        split <<= 1;
      }

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );
      arc -= 2;

    } while ( --draw );
  }